

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurvesTests.cpp
# Opt level: O0

void __thiscall
agge::tests::ArcCurveTests::RewindingArcIteratorStartsOverWithPoints(ArcCurveTests *this)

{
  float fVar1;
  float fVar2;
  point pVar3;
  allocator local_f9;
  string local_f8 [32];
  LocationInfo local_d8;
  point local_b0;
  undefined1 local_a0 [8];
  point reference [1];
  real_t rStack_8c;
  real_t local_88;
  undefined1 local_80 [8];
  point points [1];
  undefined1 local_30 [8];
  arc a;
  ArcCurveTests *this_local;
  
  a._24_8_ = this;
  arc::arc((arc *)local_30,13.1,-17.2,10.1,0.7853982,4.712389,0.05);
  vertex<agge::arc>((arc *)local_30);
  join_0x00000000_0x00001200_ = vertex<agge::arc>((arc *)local_30);
  arc::rewind((arc *)local_30,(FILE *)0x0);
  pVar3 = vertex<agge::arc>((arc *)local_30);
  local_88 = (real_t)pVar3.command;
  points[0].x = local_88;
  stack0xffffffffffffff70 = pVar3._0_8_;
  local_80._0_4_ = reference[0].command;
  local_80._4_4_ = rStack_8c;
  unique0x10000183 = pVar3;
  fVar1 = sqrtf(2.0);
  fVar2 = sqrtf(2.0);
  pVar3 = moveto(fVar1 * 10.1 * 0.5 + 13.1,fVar2 * 10.1 * 0.5 + -17.2);
  local_b0.command = pVar3.command;
  reference[0].x = (real_t)local_b0.command;
  local_b0._0_8_ = pVar3._0_8_;
  local_a0._0_4_ = local_b0.x;
  local_a0._4_4_ = local_b0.y;
  local_b0 = pVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,&local_f9);
  ut::LocationInfo::LocationInfo(&local_d8,(string *)local_f8,0x19b);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,1ul>
            ((point (*) [1])local_a0,(point (*) [1])local_80,&local_d8);
  ut::LocationInfo::~LocationInfo(&local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  return;
}

Assistant:

test( RewindingArcIteratorStartsOverWithPoints )
			{
				// INIT
				arc a(13.1f, -17.2f, 10.1f, 0.25f * pi, 1.5f * pi);

				vertex(a), vertex(a);

				// ACT
				a.rewind(0);

				// ASSERT
				mocks::path::point points[] = { vertex(a), };
				mocks::path::point reference[] = { moveto(13.1f + 10.1f * sqrtf(2) / 2.0f, -17.2f + 10.1f * sqrtf(2) / 2.0f), };

				assert_equal(reference, points);
			}